

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FederateInfo.cpp
# Opt level: O3

void __thiscall helics::FederateInfo::injectParser(FederateInfo *this,App *app)

{
  HelicsConfigJSON *pHVar1;
  undefined1 local_70 [8];
  App_p local_68;
  pair<int,_int> *local_58 [2];
  pair<int,_int> local_48 [2];
  _Any_data local_38;
  code *local_28;
  code *local_20;
  
  makeCLIApp((FederateInfo *)local_70);
  *(bool *)((long)local_70 + 0x48) = false;
  helicsCLI11App::add_config_validation((helicsCLI11App *)local_70);
  local_20 = CLI::std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/application_api/FederateInfo.cpp:478:29)>
             ::_M_invoke;
  local_28 = CLI::std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/application_api/FederateInfo.cpp:478:29)>
             ::_M_manager;
  local_38._M_unused._M_object = app;
  local_38._8_8_ = this;
  std::function<void_()>::operator=
            ((function<void_()> *)((long)local_70 + 0x90),(function<void_()> *)&local_38);
  if (local_28 != (code *)0x0) {
    (*local_28)((_Any_data *)&local_38,(_Any_data *)&local_38,__destroy_functor);
  }
  std::__shared_ptr<CLI::App,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<helics::helicsCLI11App,std::default_delete<helics::helicsCLI11App>,void>
            ((__shared_ptr<CLI::App,(__gnu_cxx::_Lock_policy)2> *)&local_68,
             (unique_ptr<helics::helicsCLI11App,_std::default_delete<helics::helicsCLI11App>_> *)
             local_70);
  CLI::App::add_subcommand(app,&local_68);
  if (local_68.super___shared_ptr<CLI::App,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    CLI::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_68.super___shared_ptr<CLI::App,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
  }
  pHVar1 = addJsonConfig(app);
  (pHVar1->super_ConfigBase).maximumLayers = '\0';
  local_58[0] = local_48;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_58,"helics","");
  injectParser();
  return;
}

Assistant:

void FederateInfo::injectParser(CLI::App* app)
{
    auto lparser = makeCLIApp();
    // extras need to go up into the parent app
    lparser->allow_extras(false);
    lparser->add_config_validation();
    lparser->final_callback([app, this]() { config_additional(app); });
    app->add_subcommand(std::move(lparser));
    // make sure the injector has json configuration handling capability
    auto* fmtr = addJsonConfig(app);
    fmtr->maxLayers(0);
    fmtr->promoteSection("helics");
}